

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# depfile_parser_test.cc
# Opt level: O0

void __thiscall
RegisterDepfileParserTestMultipleRulesTolerateMP::RegisterDepfileParserTestMultipleRulesTolerateMP
          (RegisterDepfileParserTestMultipleRulesTolerateMP *this)

{
  RegisterDepfileParserTestMultipleRulesTolerateMP *this_local;
  
  RegisterTest(DepfileParserTestMultipleRulesTolerateMP::Create,
               "DepfileParserTest.MultipleRulesTolerateMP");
  return;
}

Assistant:

TEST_F(DepfileParserTest, MultipleRulesTolerateMP) {
  string err;
  EXPECT_TRUE(Parse("foo: x\n"
                    "x:\n"
                    "foo: y\n"
                    "y:\n"
                    "foo: z\n"
                    "z:\n", &err));
  ASSERT_EQ(1u, parser_.outs_.size());
  ASSERT_EQ("foo", parser_.outs_[0].AsString());
  ASSERT_EQ(3u, parser_.ins_.size());
  EXPECT_EQ("x", parser_.ins_[0].AsString());
  EXPECT_EQ("y", parser_.ins_[1].AsString());
  EXPECT_EQ("z", parser_.ins_[2].AsString());
}